

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O0

void __thiscall jsoncons::bson::oid_t::oid_t(oid_t *this,string_view *str)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  array<unsigned_char,_12UL> *in_RDI;
  size_t i;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar3 = std::array<unsigned_char,_12UL>::size(in_RDI);
    if (sVar3 <= local_18) break;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](in_RSI,local_18 << 1)
    ;
    bVar1 = parse_hex_char(*pvVar4);
    iVar2 = (uint)bVar1 << 4;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (in_RSI,local_18 * 2 + 1);
    bVar1 = parse_hex_char(*pvVar4);
    in_stack_ffffffffffffffd4 = CONCAT13((byte)iVar2 | bVar1,(int3)in_stack_ffffffffffffffd4);
    pvVar5 = std::array<unsigned_char,_12UL>::operator[]
                       ((array<unsigned_char,_12UL> *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),
                        in_stack_ffffffffffffffc8);
    *pvVar5 = (value_type_conflict)((uint)in_stack_ffffffffffffffd4 >> 0x18);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

oid_t(const string_view& str)
        {
            for (std::size_t i = 0; i < bytes_.size(); i++) 
            {
               bytes_[i] = ((parse_hex_char (str[2 * i]) << 4) |
                           (parse_hex_char (str[2 * i + 1])));
            }
        }